

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkRayTracingPipelineCreateInfoKHR *pipe,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  Value dyn;
  Value iface;
  Value groups;
  Value group;
  Value stages;
  Data local_d8;
  Data local_c8;
  Data local_b8;
  Data local_a8;
  Data local_98;
  Data *local_88;
  ulong local_80;
  Data local_78;
  StringRefType local_68;
  Data local_58;
  StringRefType local_40;
  
  local_b8.n.i64 = (Number)0x0;
  local_b8.s.str = (Ch *)0x3000000000000;
  local_c8._4_1_ = '\0';
  local_c8._5_1_ = '\0';
  local_c8._6_1_ = '\0';
  local_c8._7_1_ = '\0';
  local_c8._0_4_ = pipe->flags;
  local_d8.s.str = (Ch *)0x405000000150d6f;
  local_d8.n = (Number)0x5;
  local_c8.s.str = (Ch *)((ulong)(-1 < (int)pipe->flags) << 0x35 | 0x1d6000000000000);
  local_88 = &out_value->data_;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_d8.s,(uint64_t)pipe->layout,alloc);
  local_c8.s.str = (Ch *)0x405000000151436;
  local_c8.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&local_d8.s,(uint64_t)pipe->basePipelineHandle,alloc);
  local_c8.s.str = (Ch *)0x40500000015104e;
  local_c8.n = (Number)0x12;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,alloc);
  local_40.s = "basePipelineIndex";
  local_40.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_b8.s,&local_40,pipe->basePipelineIndex,alloc);
  local_c8._4_1_ = '\0';
  local_c8._5_1_ = '\0';
  local_c8._6_1_ = '\0';
  local_c8._7_1_ = '\0';
  local_c8._0_4_ = pipe->maxPipelineRayRecursionDepth;
  local_d8.s.str = (Ch *)0x40500000015144b;
  local_d8.n = (Number)0x1c;
  local_c8.s.str =
       (Ch *)((ulong)(-1 < (int)pipe->maxPipelineRayRecursionDepth) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_b8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_c8.s,alloc);
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    local_d8.n.i64 = (Number)0x0;
    local_d8.s.str = (Ch *)0x0;
    json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              (pipe->pDynamicState,alloc,(Value *)&local_d8.s);
    local_c8.s.str = (Ch *)0x405000000151356;
    local_c8.n.i64 = (Number)0xc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_d8.s,alloc);
  }
  local_58.n = (Number)0x0;
  local_58.s.str = (Ch *)0x0;
  bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    (pipe->pStages,pipe->stageCount,alloc,(Value *)&local_58.s);
  if (bVar3) {
    local_c8.s.str = (Ch *)0x405000000151468;
    local_c8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_58.s,alloc);
    if (pipe->pLibraryInterface != (VkRayTracingPipelineInterfaceCreateInfoKHR *)0x0) {
      local_a8.n.i64 = (Number)0x0;
      local_a8.s.str = (Ch *)0x3000000000000;
      uVar1 = pipe->pLibraryInterface->maxPipelineRayPayloadSize;
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      local_c8._0_4_ = uVar1;
      local_d8.s.str = (Ch *)0x4050000001513a7;
      local_d8.n = (Number)0x19;
      local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,alloc);
      uVar1 = pipe->pLibraryInterface->maxPipelineRayHitAttributeSize;
      local_c8._4_1_ = '\0';
      local_c8._5_1_ = '\0';
      local_c8._6_1_ = '\0';
      local_c8._7_1_ = '\0';
      local_c8._0_4_ = uVar1;
      local_d8.s.str = (Ch *)0x4050000001513c1;
      local_d8.n.i64 = (Number)0x1e;
      local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_d8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,alloc);
      pvVar2 = pipe->pLibraryInterface->pNext;
      if (pvVar2 != (void *)0x0) {
        local_d8.n.i64 = (Number)0x0;
        local_d8.s.str = (Ch *)0x0;
        bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar2,alloc,(Value *)&local_d8.s,(DynamicStateInfo *)0x0);
        if (!bVar3) goto LAB_001317e6;
        local_c8.s.str = (Ch *)0x405000000150e25;
        local_c8.n = (Number)0x5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_a8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,alloc);
      }
      local_c8.s.str = (Ch *)0x405000000151476;
      local_c8.n.i64 = (Number)0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,alloc);
    }
    if (pipe->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      local_a8.n.i64 = (Number)0x0;
      local_a8.s.str = (Ch *)0x0;
      bVar3 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pLibraryInfo,alloc,false,(Value *)&local_a8.s);
      if (!bVar3) goto LAB_001317e6;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>();
    }
    local_98.n = (Number)0x0;
    local_98.s.str = (Ch *)0x4000000000000;
    if (pipe->groupCount != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        local_78.n.i64 = (Number)0x0;
        local_78.s.str = (Ch *)0x3000000000000;
        uVar1 = *(uint *)((long)&pipe->pGroups->anyHitShader + lVar4);
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        local_c8._0_4_ = uVar1;
        local_d8.s.str = (Ch *)0x405000000151376;
        local_d8.n = (Number)0xc;
        local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        local_80 = uVar5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_78.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,alloc);
        uVar1 = *(uint *)((long)&pipe->pGroups->intersectionShader + lVar4);
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        local_c8._0_4_ = uVar1;
        local_d8.s.str = (Ch *)0x405000000151363;
        local_d8.n = (Number)0x12;
        local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_78.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,alloc);
        uVar1 = *(uint *)((long)&pipe->pGroups->generalShader + lVar4);
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        local_c8._0_4_ = uVar1;
        local_d8.s.str = (Ch *)0x405000000151394;
        local_d8.n = (Number)0xd;
        local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_78.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,alloc);
        uVar5 = local_80;
        uVar1 = *(uint *)((long)&pipe->pGroups->closestHitShader + lVar4);
        local_c8._4_1_ = '\0';
        local_c8._5_1_ = '\0';
        local_c8._6_1_ = '\0';
        local_c8._7_1_ = '\0';
        local_c8._0_4_ = uVar1;
        local_d8.s.str = (Ch *)0x405000000151383;
        local_d8.n.i64 = (Number)0x10;
        local_c8.s.str = (Ch *)((ulong)(-1 < (int)uVar1) << 0x35 | 0x1d6000000000000);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_78.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_d8.s,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_c8.s,alloc);
        local_68.s = "type";
        local_68.length = 4;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkRayTracingShaderGroupTypeKHR>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_78.s,&local_68,
                   *(VkRayTracingShaderGroupTypeKHR *)((long)&pipe->pGroups->type + lVar4),alloc);
        pvVar2 = *(void **)((long)&pipe->pGroups->pNext + lVar4);
        if (pvVar2 != (void *)0x0) {
          local_d8.n.i64 = (Number)0x0;
          local_d8.s.str = (Ch *)0x0;
          bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            (pvVar2,alloc,(Value *)&local_d8.s,(DynamicStateInfo *)0x0);
          if (!bVar3) goto LAB_001317e6;
          local_c8.s.str = (Ch *)0x405000000150e25;
          local_c8.n.i64 = (Number)0x5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_78.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_c8.s,
                      (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_d8.s,alloc);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_98.s,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&local_78.s,alloc);
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x30;
      } while (uVar5 < pipe->groupCount);
    }
    local_c8.s.str = (Ch *)0x40500000015146f;
    local_c8.n = (Number)0x6;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_b8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_c8.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_98.s,alloc);
    if (pipe->pNext != (void *)0x0) {
      local_d8.n = (Number)0x0;
      local_d8.s.str = (Ch *)0x0;
      bVar3 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,(Value *)&local_d8.s,(DynamicStateInfo *)0x0);
      if (!bVar3) goto LAB_001317e6;
      local_c8.s.str = (Ch *)0x405000000150e25;
      local_c8.n = (Number)0x5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_b8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_c8.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_d8.s,alloc);
    }
    bVar3 = true;
    if (&local_b8 != local_88) {
      local_88->n = local_b8.n;
      (&local_88->n)[1] = (Number)local_b8.s.str;
    }
  }
  else {
LAB_001317e6:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool json_value(const VkRayTracingPipelineCreateInfoKHR &pipe, Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("maxPipelineRayRecursionDepth", pipe.maxPipelineRayRecursionDepth, alloc);

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	Value stages;
	if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
		return false;
	p.AddMember("stages", stages, alloc);

	if (pipe.pLibraryInterface)
	{
		Value iface(kObjectType);
		iface.AddMember("maxPipelineRayPayloadSize", pipe.pLibraryInterface->maxPipelineRayPayloadSize, alloc);
		iface.AddMember("maxPipelineRayHitAttributeSize", pipe.pLibraryInterface->maxPipelineRayHitAttributeSize, alloc);
		if (!pnext_chain_add_json_value(iface, *pipe.pLibraryInterface, alloc, nullptr))
			return false;
		p.AddMember("libraryInterface", iface, alloc);
	}

	if (pipe.pLibraryInfo)
	{
		Value library_info;
		if (!json_value(*pipe.pLibraryInfo, alloc, false, &library_info))
			return false;
		p.AddMember("libraryInfo", library_info, alloc);
	}

	Value groups(kArrayType);
	for (uint32_t i = 0; i < pipe.groupCount; i++)
	{
		Value group(kObjectType);
		group.AddMember("anyHitShader", pipe.pGroups[i].anyHitShader, alloc);
		group.AddMember("intersectionShader", pipe.pGroups[i].intersectionShader, alloc);
		group.AddMember("generalShader", pipe.pGroups[i].generalShader, alloc);
		group.AddMember("closestHitShader", pipe.pGroups[i].closestHitShader, alloc);
		group.AddMember("type", pipe.pGroups[i].type, alloc);
		if (!pnext_chain_add_json_value(group, pipe.pGroups[i], alloc, nullptr))
			return false;
		groups.PushBack(group, alloc);
	}
	p.AddMember("groups", groups, alloc);

	if (!pnext_chain_add_json_value(p, pipe, alloc, nullptr))
		return false;

	*out_value = p;
	return true;
}